

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O1

void __thiscall
chaiscript::ChaiScript_Basic::register_namespace
          (ChaiScript_Basic *this,
          function<void_(chaiscript::dispatch::Dynamic_Object_&)> *t_namespace_generator,
          string *t_namespace_name)

{
  function<void_(chaiscript::dispatch::Dynamic_Object_&)> *this_00;
  function<void_(chaiscript::dispatch::Dynamic_Object_&)> *pfVar1;
  const_iterator cVar2;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  unique_lock<chaiscript::detail::threading::recursive_mutex> l;
  unique_lock<std::recursive_mutex> local_158;
  anon_class_120_2_ba9586a2_for_second local_148;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ChaiScript[P]ChaiScript_include_chaiscript_language_chaiscript_engine_hpp:699:73)>
  local_c8;
  
  local_158._M_device = &this->m_use_mutex;
  local_158._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_158);
  local_158._M_owns = true;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<chaiscript::dispatch::Dynamic_Object_&()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<chaiscript::dispatch::Dynamic_Object_&()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<chaiscript::dispatch::Dynamic_Object_&()>_>_>_>
          ::find(&(this->m_namespace_generators)._M_t,t_namespace_name);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(this->m_namespace_generators)._M_t._M_impl.super__Rb_tree_header) {
    local_148.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_148.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header;
    local_148.space.m_type_name.field_2._8_8_ = 0;
    local_148.space.m_attrs._M_t._M_impl._0_8_ = 0;
    local_148.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    paVar4 = &local_148.space.m_type_name.field_2;
    local_148.space.m_type_name._M_string_length = 0;
    local_148.space.m_type_name.field_2._M_allocated_capacity = 0;
    local_148.space.m_option_explicit = false;
    local_148.space._33_7_ = 0;
    local_148.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_148.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_148.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    this_00 = &local_148.t_namespace_generator;
    local_148.space.m_type_name._M_dataplus._M_p = (pointer)paVar4;
    local_148.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_148.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::function<void_(chaiscript::dispatch::Dynamic_Object_&)>::function
              (this_00,t_namespace_generator);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_engine.hpp:699:73)>
    ::
    pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ChaiScript[P]ChaiScript_include_chaiscript_language_chaiscript_engine_hpp:699:73),_true>
              (&local_c8,t_namespace_name,&local_148);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<chaiscript::dispatch::Dynamic_Object&()>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<chaiscript::dispatch::Dynamic_Object&()>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<chaiscript::dispatch::Dynamic_Object&()>>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,chaiscript::ChaiScript_Basic::register_namespace(std::function<void(chaiscript::dispatch::Dynamic_Object&)>const&,std::__cxx11::string_const&)::_lambda()_1_>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<chaiscript::dispatch::Dynamic_Object&()>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<chaiscript::dispatch::Dynamic_Object&()>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<chaiscript::dispatch::Dynamic_Object&()>>>>
                *)&this->m_namespace_generators,&local_c8);
    if (local_c8.second.t_namespace_generator.super__Function_base._M_manager != (_Manager_type)0x0)
    {
      pfVar1 = &local_c8.second.t_namespace_generator;
      (*local_c8.second.t_namespace_generator.super__Function_base._M_manager)
                ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
    ::~_Rb_tree(&local_c8.second.space.m_attrs._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.second.space.m_type_name._M_dataplus._M_p !=
        &local_c8.second.space.m_type_name.field_2) {
      operator_delete(local_c8.second.space.m_type_name._M_dataplus._M_p,
                      local_c8.second.space.m_type_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.first._M_dataplus._M_p != &local_c8.first.field_2) {
      operator_delete(local_c8.first._M_dataplus._M_p,
                      local_c8.first.field_2._M_allocated_capacity + 1);
    }
    if (local_148.t_namespace_generator.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_148.t_namespace_generator.super__Function_base._M_manager)
                ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
    ::~_Rb_tree(&local_148.space.m_attrs._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.space.m_type_name._M_dataplus._M_p != paVar4) {
      operator_delete(local_148.space.m_type_name._M_dataplus._M_p,
                      local_148.space.m_type_name.field_2._M_allocated_capacity + 1);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_158);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148,
                 "Namespace: ",t_namespace_name);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_148," was already registered.");
  local_c8.first._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.first._M_dataplus._M_p == paVar4) {
    local_c8.first.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_c8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_c8.first._M_dataplus._M_p = (pointer)&local_c8.first.field_2;
  }
  else {
    local_c8.first.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_c8.first._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  std::runtime_error::runtime_error(this_01,(string *)&local_c8);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void register_namespace(const std::function<void(Namespace &)> &t_namespace_generator, const std::string &t_namespace_name) {
      chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::recursive_mutex> l(m_use_mutex);

      if (!m_namespace_generators.count(t_namespace_name)) {
        // contain the namespace object memory within the m_namespace_generators map
        m_namespace_generators.emplace(std::make_pair(t_namespace_name, [=, space = Namespace()]() mutable -> Namespace & {
          t_namespace_generator(space);
          return space;
        }));
      } else {
        throw std::runtime_error("Namespace: " + t_namespace_name + " was already registered.");
      }
    }